

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void search_norestore(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                     RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  image_pyramid *piVar1;
  YV12_BUFFER_CONFIG *in_RDX;
  RestorationTileLimits *in_R9;
  int highbd;
  RestSearchCtxt *rsc;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  
  piVar1 = (image_pyramid *)
           sse_restoration_unit
                     (in_R9,in_RDX,
                      (YV12_BUFFER_CONFIG *)
                      (ulong)CONCAT14(*(undefined1 *)
                                       (*(long *)((long)in_RDX->field_2 + 0x6088) + 0x4c),
                                      in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                      in_stack_ffffffffffffffb8);
  in_RDX->y_pyramid = piVar1;
  *(char **)&in_RDX->border = (in_RDX->y_pyramid->mutex).__size + *(long *)&in_RDX->border;
  return;
}

Assistant:

static inline void search_norestore(
    const RestorationTileLimits *limits, int rest_unit_idx, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs,
    struct aom_internal_error_info *error_info) {
  (void)rest_unit_idx;
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;

  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;

  const int highbd = rsc->cm->seq_params->use_highbitdepth;
  rsc->sse[RESTORE_NONE] = sse_restoration_unit(
      limits, rsc->src, &rsc->cm->cur_frame->buf, rsc->plane, highbd);

  rsc->total_sse[RESTORE_NONE] += rsc->sse[RESTORE_NONE];
}